

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar5.c
# Opt level: O1

void test_read_format_rar5_multiple_files_solid(void)

{
  long lVar1;
  int iVar2;
  wchar_t wVar3;
  uint uVar4;
  archive_conflict *a;
  char *pcVar5;
  la_int64_t lVar6;
  la_ssize_t lVar7;
  long lVar8;
  int iVar9;
  archive_entry *ae;
  uint8_t buff [4096];
  archive_entry *local_1040;
  undefined1 local_1038 [4104];
  
  extract_reference_file("test_read_format_rar5_multiple_files_solid.rar");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'â',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_filter_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'â',(uint)(iVar2 == 0),"0 == archive_read_support_filter_all(a)",a);
  iVar2 = archive_read_support_format_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'â',(uint)(iVar2 == 0),"0 == archive_read_support_format_all(a)",a);
  wVar3 = archive_read_open_filename(a,"test_read_format_rar5_multiple_files_solid.rar",0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'â',(uint)(wVar3 == L'\0'),
                   "0 == archive_read_open_filename(a, \"test_read_format_rar5_multiple_files_solid.rar\", 10240)"
                   ,a);
  iVar2 = archive_read_next_header((archive *)a,&local_1040);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ä',(uint)(iVar2 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar5 = archive_entry_pathname(local_1040);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
             ,L'å',"test1.bin","\"test1.bin\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  lVar6 = archive_entry_size(local_1040);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'æ',0x1000,"DATA_SIZE",lVar6,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_1038,0x1000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ç',(uint)(lVar7 == 0x1000),
                   "DATA_SIZE == archive_read_data(a, buff, DATA_SIZE)",a);
  iVar2 = 1;
  lVar1 = 0;
  do {
    lVar8 = lVar1;
    if (lVar8 == 0x1000) break;
    iVar9 = (iVar2 + -3) * iVar2;
    if (iVar9 < -1) {
      iVar9 = -2;
    }
    uVar4 = i4le(local_1038 + lVar8);
    iVar2 = iVar2 + 1;
    lVar1 = lVar8 + 4;
  } while (uVar4 == iVar9 + 2U);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'è',(uint)(lVar8 == 0x1000),"1 == verify_data(buff, 1, DATA_SIZE)",a);
  iVar2 = archive_read_next_header((archive *)a,&local_1040);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ê',(uint)(iVar2 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar5 = archive_entry_pathname(local_1040);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
             ,L'ë',"test2.bin","\"test2.bin\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  lVar6 = archive_entry_size(local_1040);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'ì',0x1000,"DATA_SIZE",lVar6,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_1038,0x1000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'í',(uint)(lVar7 == 0x1000),
                   "DATA_SIZE == archive_read_data(a, buff, DATA_SIZE)",a);
  iVar2 = 1;
  lVar1 = 0;
  do {
    lVar8 = lVar1;
    if (lVar8 == 0x1000) break;
    iVar9 = (iVar2 + -3) * iVar2;
    if (iVar9 < -2) {
      iVar9 = -3;
    }
    uVar4 = i4le(local_1038 + lVar8);
    iVar2 = iVar2 + 1;
    lVar1 = lVar8 + 4;
  } while (uVar4 == iVar9 + 3U);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'î',(uint)(lVar8 == 0x1000),"1 == verify_data(buff, 2, DATA_SIZE)",a);
  iVar2 = archive_read_next_header((archive *)a,&local_1040);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ð',(uint)(iVar2 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar5 = archive_entry_pathname(local_1040);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
             ,L'ñ',"test3.bin","\"test3.bin\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  lVar6 = archive_entry_size(local_1040);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'ò',0x1000,"DATA_SIZE",lVar6,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_1038,0x1000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ó',(uint)(lVar7 == 0x1000),
                   "DATA_SIZE == archive_read_data(a, buff, DATA_SIZE)",a);
  iVar2 = 1;
  lVar1 = 0;
  do {
    lVar8 = lVar1;
    if (lVar8 == 0x1000) break;
    iVar9 = (iVar2 + -3) * iVar2;
    if (iVar9 < -3) {
      iVar9 = -4;
    }
    uVar4 = i4le(local_1038 + lVar8);
    iVar2 = iVar2 + 1;
    lVar1 = lVar8 + 4;
  } while (uVar4 == iVar9 + 4U);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ô',(uint)(lVar8 == 0x1000),"1 == verify_data(buff, 3, DATA_SIZE)",a);
  iVar2 = archive_read_next_header((archive *)a,&local_1040);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ö',(uint)(iVar2 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar5 = archive_entry_pathname(local_1040);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
             ,L'÷',"test4.bin","\"test4.bin\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  lVar6 = archive_entry_size(local_1040);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'ø',0x1000,"DATA_SIZE",lVar6,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_1038,0x1000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ù',(uint)(lVar7 == 0x1000),
                   "DATA_SIZE == archive_read_data(a, buff, DATA_SIZE)",a);
  iVar2 = 1;
  lVar1 = 0;
  do {
    lVar8 = lVar1;
    if (lVar8 == 0x1000) break;
    iVar9 = (iVar2 + -3) * iVar2;
    if (iVar9 < -4) {
      iVar9 = -5;
    }
    uVar4 = i4le(local_1038 + lVar8);
    iVar2 = iVar2 + 1;
    lVar1 = lVar8 + 4;
  } while (uVar4 == iVar9 + 5U);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ú',(uint)(lVar8 == 0x1000),"1 == verify_data(buff, 4, DATA_SIZE)",a);
  iVar2 = archive_read_next_header((archive *)a,&local_1040);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ü',(uint)(iVar2 == 1),"ARCHIVE_EOF == archive_read_next_header(a, &ae)",a);
  iVar2 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'ý',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",a);
  iVar2 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'ý',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar5_multiple_files_solid)
{
	const int DATA_SIZE = 4096;
	uint8_t buff[4096];

	PROLOGUE("test_read_format_rar5_multiple_files_solid.rar");

	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString("test1.bin", archive_entry_pathname(ae));
	assertEqualInt(DATA_SIZE, archive_entry_size(ae));
	assertA(DATA_SIZE == archive_read_data(a, buff, DATA_SIZE));
	assertA(1 == verify_data(buff, 1, DATA_SIZE));

	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString("test2.bin", archive_entry_pathname(ae));
	assertEqualInt(DATA_SIZE, archive_entry_size(ae));
	assertA(DATA_SIZE == archive_read_data(a, buff, DATA_SIZE));
	assertA(1 == verify_data(buff, 2, DATA_SIZE));

	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString("test3.bin", archive_entry_pathname(ae));
	assertEqualInt(DATA_SIZE, archive_entry_size(ae));
	assertA(DATA_SIZE == archive_read_data(a, buff, DATA_SIZE));
	assertA(1 == verify_data(buff, 3, DATA_SIZE));

	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString("test4.bin", archive_entry_pathname(ae));
	assertEqualInt(DATA_SIZE, archive_entry_size(ae));
	assertA(DATA_SIZE == archive_read_data(a, buff, DATA_SIZE));
	assertA(1 == verify_data(buff, 4, DATA_SIZE));

	assertA(ARCHIVE_EOF == archive_read_next_header(a, &ae));
	EPILOGUE();
}